

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

int __thiscall problem_parser::get_or_assign_variable(problem_parser *this,string_view value)

{
  pointer *ppbVar1;
  ulong uVar2;
  iterator __position;
  string_view str;
  iterator iVar3;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  _Var4;
  int size;
  string_view string;
  int local_48 [4];
  string_view local_38;
  key_type local_28;
  
  local_28._M_str = value._M_str;
  local_28._M_len = value._M_len;
  iVar3 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_cache_variable)._M_h,&local_28);
  _Var4 = iVar3.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
          ._M_cur;
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
      ._M_cur != (__node_type *)0x0) {
    _Var4._M_cur = (__node_type *)
                   (ulong)*(uint *)((long)iVar3.
                                          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                                          ._M_cur + 0x18);
  }
  local_48[0] = (int)_Var4._M_cur;
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    uVar2 = (this->m_cache_variable)._M_h._M_element_count;
    local_48[0] = -1;
    if (uVar2 < 0x80000000) {
      local_48[0] = (int)uVar2;
      str._M_str = local_28._M_str;
      str._M_len = local_28._M_len;
      local_38 = baryonyx::string_buffer::append
                           ((this->m_problem).strings.
                            super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,str);
      std::__detail::
      _Insert_base<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::try_emplace<std::basic_string_view<char,std::char_traits<char>>const&,int&>
                ((_Insert_base<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->m_cache_variable,(const_iterator)0x0,&local_38,local_48);
      __position._M_current =
           (this->m_problem).vars.names.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_problem).vars.names.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)&(this->m_problem).vars,__position,&local_38);
      }
      else {
        (__position._M_current)->_M_len = local_38._M_len;
        (__position._M_current)->_M_str = local_38._M_str;
        ppbVar1 = &(this->m_problem).vars.names.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      local_48[3] = 0;
      local_48[2] = 0x7fffffff;
      local_48[1] = 0;
      std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>::
      emplace_back<int,int,baryonyx::variable_type>
                ((vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>> *)
                 &(this->m_problem).vars.values,local_48 + 3,local_48 + 2,
                 (variable_type *)(local_48 + 1));
    }
  }
  return local_48[0];
}

Assistant:

int get_or_assign_variable(const std::string_view value)
    {
        if (auto it = m_cache_variable.find(value);
            it != m_cache_variable.end())
            return it->second;

        if (m_cache_variable.size() > baryonyx::to_unsigned(INT_MAX))
            return -1;

        auto size = static_cast<int>(m_cache_variable.size());
        auto string = m_problem.strings->append(value);

        m_cache_variable.try_emplace(string, size);

        m_problem.vars.names.emplace_back(string);
        m_problem.vars.values.emplace_back(
          0, std::numeric_limits<int>::max(), baryonyx::variable_type::real);

        return size;
    }